

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_copy_to_file.hpp
# Opt level: O2

void __thiscall duckdb::LogicalCopyToFile::ResolveTypes(LogicalCopyToFile *this)

{
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> vStack_28;
  
  GetCopyFunctionReturnLogicalTypes
            ((vector<duckdb::LogicalType,_true> *)&vStack_28,this->return_type);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
            (&(this->super_LogicalOperator).types.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,&vStack_28);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&vStack_28);
  return;
}

Assistant:

void ResolveTypes() override {
		types = GetCopyFunctionReturnLogicalTypes(return_type);
	}